

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_inserts.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  size_t buffer_size;
  size_t i;
  long lVar5;
  undefined1 auVar6 [16];
  double dVar7;
  BlindHashMapIterator<BCL::HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  iter;
  BlindHashMapReference<BCL::HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  local_f0;
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  map;
  HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  buffer;
  
  BCL::init((BCL *)0x100,(EVP_PKEY_CTX *)0x0);
  lVar3 = BCL::my_nprocs * 10;
  auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar6._0_8_ = lVar3;
  auVar6._12_4_ = 0x45300000;
  dVar7 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  dVar7 = dVar7 + dVar7;
  uVar4 = (ulong)dVar7;
  BCL::
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  ::HashMap(&map,(long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4);
  buffer_size = 1;
  if (BCL::my_nprocs < 0xb) {
    buffer_size = 10 / BCL::my_nprocs;
  }
  BCL::
  HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  ::HashMapBuffer(&buffer,&map,0x14,buffer_size);
  lVar3 = 0;
  do {
    if (lVar3 == 10) {
      BCL::
      HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
      ::flush(&buffer);
      if (BCL::my_rank == 0) {
        lVar3 = 0;
        for (uVar4 = 0; uVar4 < BCL::my_nprocs; uVar4 = uVar4 + 1) {
          for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
            std::__cxx11::to_string(&local_f0.key_,lVar5 + lVar3);
            std::__cxx11::string::string((string *)&iter,(string *)&local_f0);
            iter.atomicity_level_.val = 3;
            iter.hashmap_ = &map;
            std::__cxx11::string::~string((string *)&local_f0);
            BCL::
            BlindHashMapIterator<BCL::HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
            ::operator*(&local_f0,&iter);
            uVar2 = BCL::BlindHashMapReference::operator_cast_to_int
                              ((BlindHashMapReference *)&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            printf("%lu: %d\n",BCL::my_rank * 10 + uVar4,(ulong)uVar2);
            std::__cxx11::string::~string((string *)&iter);
          }
          lVar3 = lVar3 + 10;
        }
      }
      BCL::finalize();
      BCL::
      HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
      ::~HashMapBuffer(&buffer);
      BCL::
      HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
      ::~HashMap(&map);
      return 0;
    }
    std::__cxx11::to_string(&iter.key_,BCL::my_rank * 10 + lVar3);
    local_f0.key_._M_dataplus._M_p._0_4_ = (undefined4)lVar3;
    bVar1 = BCL::
            HashMapBuffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
            ::insert(&buffer,&iter.key_,(int *)&local_f0);
    std::__cxx11::string::~string((string *)&iter);
    lVar3 = lVar3 + 1;
  } while (bVar1);
  __assert_fail("success",
                "/workspace/llm4binary/github/license_c_cmakelists/berkeley-container-library[P]bcl/examples/hashmap/buffered_inserts.cpp"
                ,0x1a,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv) {
  BCL::init();

  size_t n_to_insert = 10;

  double load_factor = 0.5;
  BCL::HashMap<std::string, int> map(n_to_insert*BCL::nprocs() / load_factor);

  BCL::HashMapBuffer<std::string, int> buffer(map,
                                              n_to_insert*2,
                                              std::max<size_t>(n_to_insert/BCL::nprocs(), 1));

  for (size_t i = 0; i < n_to_insert; i++) {
    bool success = buffer.insert(std::to_string(n_to_insert*BCL::rank() + i), i);
    assert(success);
  }

  buffer.flush();

  if (BCL::rank() == 0) {
    for (size_t i = 0; i < BCL::nprocs(); i++) {

      for (size_t j = 0; j < n_to_insert; j++) {
        auto iter = map.find(std::to_string(n_to_insert*i + j));
        int value = *iter;
        printf("%lu: %d\n", n_to_insert*BCL::rank() + i, value);
      }
    }
  }

  BCL::finalize();
  return 0;
}